

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O2

void setShiftPermute(int s)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint local_28 [2];
  int ss [6];
  
  piVar1 = permute;
  local_28[0] = 0;
  for (lVar5 = 1; lVar5 != 6; lVar5 = lVar5 + 1) {
    next = next * 0x41c64e6d + 0x3039;
    local_28[lVar5] = ((uint)(next >> 0x10) & 0x7fff) % 200;
  }
  uVar4 = 0;
  while( true ) {
    piVar3 = unpermute;
    piVar2 = permute;
    uVar6 = (ulong)numOfVariables;
    if ((long)uVar6 < (long)(uVar4 + 1)) break;
    piVar1[uVar4 + 1] =
         (int)(groupSize *
               local_28[(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff)
                             % (long)groupSize)] + (int)uVar4) % numOfVariables + 1;
    uVar4 = uVar4 + 1;
  }
  for (lVar5 = 1; lVar5 <= (int)uVar6; lVar5 = lVar5 + 1) {
    piVar3[piVar2[lVar5]] = (int)lVar5;
    uVar6 = (ulong)(uint)numOfVariables;
  }
  return;
}

Assistant:

void setShiftPermute (int s)
{
	int v;
	int ss[6];
	ss[0] = 0;
	for (v=1;v<=5;v++)
		ss[v] = myrand()%200;



	for (v=1;v<=numOfVariables;v++)
		permute[v] = 1 + (v-1+groupSize*ss[(v-1)%groupSize] )%numOfVariables;

	for (v=1;v<=numOfVariables;v++)
		unpermute[permute[v]] = v;

}